

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O1

size_t __thiscall
axl::sl::CircularBufferBase<char>::writeFront(CircularBufferBase<char> *this,char *p,size_t length)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  
  uVar3 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  uVar5 = uVar3 - this->m_length;
  if (length <= uVar5) {
    uVar5 = length;
  }
  __dest = (char *)0x0;
  uVar3 = ((this->m_front + uVar3) - uVar5) % uVar3;
  this->m_front = uVar3;
  bVar2 = Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive(&this->m_buffer);
  if (bVar2) {
    __dest = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p;
  }
  uVar1 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  if (uVar1 < uVar5 + uVar3) {
    sVar4 = uVar1 - uVar3;
    memmove(__dest + uVar3,p,sVar4);
    p = p + sVar4;
    sVar4 = uVar5 - sVar4;
  }
  else {
    __dest = __dest + uVar3;
    sVar4 = uVar5;
  }
  memmove(__dest,p,sVar4);
  this->m_length = this->m_length + uVar5;
  return uVar5;
}

Assistant:

size_t
	writeFront(
		const C* p,
		size_t length
	) {
		size_t leftover = m_buffer.getCount() - m_length;
		if (length > leftover)
			length = leftover;

		m_front = (m_front - length + m_buffer.getCount()) % m_buffer.getCount();
		copyTo(m_front, p, length);
		m_length += length;

		ASSERT(isValid());
		return length;
	}